

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_backend_graph_copy * ggml_backend_graph_copy(ggml_backend_t backend,ggml_cgraph *graph)

{
  ggml_init_params params_00;
  ggml_init_params params_01;
  ggml_hash_set hash_set_00;
  ggml_tensor *key;
  void *__ptr;
  size_t sVar1;
  ggml_tensor **node_copies_00;
  ggml_backend_t backend_00;
  ggml_backend_buffer *pgVar2;
  ggml_context *pgVar3;
  ggml_backend_buffer *pgVar4;
  ggml_cgraph *pgVar5;
  long in_RDX;
  ggml_tensor *in_RDI;
  ggml_tensor *node_copy;
  ggml_tensor *node_2;
  int i_2;
  ggml_cgraph *graph_copy;
  ggml_tensor *node_1;
  int i_1;
  ggml_backend_buffer_t buffer;
  ggml_tensor *node;
  int i;
  ggml_context *ctx_unallocated;
  ggml_context *ctx_allocated;
  ggml_init_params params;
  _Bool *node_init;
  ggml_tensor **node_copies;
  ggml_hash_set hash_set;
  undefined8 in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  ggml_tensor *pgVar6;
  ggml_tensor *node_init_00;
  ggml_hash_set *in_stack_ffffffffffffff10;
  int local_dc;
  int local_c4;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  int iVar7;
  undefined8 uVar8;
  undefined7 uVar9;
  undefined1 uVar10;
  ggml_context *ctx;
  undefined7 uStack_3f;
  ggml_backend_t local_28;
  ggml_tensor *local_20;
  ggml_context *local_18;
  
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  node_init_00 = in_RDI;
  ggml_hash_set_new(in_stack_fffffffffffffee0);
  key = (ggml_tensor *)calloc((size_t)local_28,8);
  __ptr = calloc((size_t)local_28,1);
  sVar1 = ggml_tensor_overhead();
  node_copies_00 = (ggml_tensor **)(sVar1 * (long)local_28);
  sVar1 = ggml_graph_overhead_custom(in_stack_fffffffffffffee0,(_Bool)uVar10);
  backend_00 = (ggml_backend_t)((long)node_copies_00 + sVar1);
  uVar9 = SUB87(backend_00,0);
  uVar10 = (undefined1)((ulong)backend_00 >> 0x38);
  sVar1 = 0;
  ctx = (ggml_context *)CONCAT71(uStack_3f,1);
  params_00.mem_buffer = (void *)in_stack_ffffffffffffff48;
  params_00.mem_size = in_stack_ffffffffffffff40;
  params_00._16_8_ = in_stack_ffffffffffffff50;
  pgVar2 = (ggml_backend_buffer *)ggml_init(params_00);
  uVar8 = CONCAT71(uStack_3f,1);
  pgVar6 = (ggml_tensor *)0x0;
  params_01.mem_buffer = (void *)in_stack_ffffffffffffff48;
  params_01.mem_size = in_stack_ffffffffffffff40;
  params_01._16_8_ = in_stack_ffffffffffffff50;
  pgVar3 = ggml_init(params_01);
  if ((pgVar2 == (ggml_backend_buffer *)0x0) || (pgVar3 == (ggml_context *)0x0)) {
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate context for graph copy\n",
                      "ggml_backend_graph_copy");
    ggml_hash_set_free((ggml_hash_set *)0x163117);
    free(key);
    free(__ptr);
    ggml_free((ggml_context *)0x16313e);
    ggml_free((ggml_context *)0x16314b);
    *(undefined8 *)in_RDI = 0;
    in_RDI->buffer = (ggml_backend_buffer *)0x0;
    in_RDI->ne[0] = 0;
    in_RDI->ne[1] = 0;
  }
  else {
    for (iVar7 = 0; iVar7 < *(int *)(in_RDX + 4); iVar7 = iVar7 + 1) {
      hash_set_00.used = (ggml_bitset_t *)pgVar3;
      hash_set_00.size = uVar8;
      hash_set_00.keys._0_7_ = uVar9;
      hash_set_00.keys._7_1_ = uVar10;
      backend_00 = local_28;
      pgVar6 = local_20;
      graph_copy_dup_tensor
                (hash_set_00,(ggml_tensor **)CONCAT44(iVar7,in_stack_ffffffffffffff68),
                 *(ggml_context **)(*(long *)(in_RDX + 0x10) + (long)iVar7 * 8),local_18,local_20);
    }
    pgVar4 = ggml_backend_alloc_ctx_tensors((ggml_context *)pgVar6,backend_00);
    if (pgVar4 == (ggml_backend_buffer *)0x0) {
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate buffer for graph copy\n",
                        "ggml_backend_graph_copy");
      ggml_hash_set_free((ggml_hash_set *)0x163287);
      free(key);
      free(__ptr);
      ggml_free((ggml_context *)0x1632ae);
      ggml_free((ggml_context *)0x1632bb);
      *(undefined8 *)in_RDI = 0;
      in_RDI->buffer = (ggml_backend_buffer *)0x0;
      in_RDI->ne[0] = 0;
      in_RDI->ne[1] = 0;
    }
    else {
      for (local_c4 = 0; local_c4 < *(int *)(in_RDX + 4); local_c4 = local_c4 + 1) {
        graph_copy_init_tensor
                  (in_stack_ffffffffffffff10,node_copies_00,(_Bool *)node_init_00,in_RDI);
      }
      pgVar5 = ggml_new_graph_custom(ctx,sVar1,(_Bool)uVar10);
      for (local_dc = 0; local_dc < *(int *)(in_RDX + 4); local_dc = local_dc + 1) {
        pgVar6 = key;
        sVar1 = ggml_hash_find((ggml_hash_set *)in_RDI,key);
        pgVar5->nodes[local_dc] = (ggml_tensor *)pgVar6->ne[sVar1 - 2];
      }
      pgVar5->n_nodes = *(int *)(in_RDX + 4);
      ggml_hash_set_free((ggml_hash_set *)0x16340c);
      free(key);
      free(__ptr);
      *(ggml_backend_buffer **)in_RDI = pgVar4;
      in_RDI->buffer = pgVar2;
      in_RDI->ne[0] = (int64_t)pgVar3;
      in_RDI->ne[1] = (int64_t)pgVar5;
    }
  }
  return (ggml_backend_graph_copy *)node_init_00;
}

Assistant:

struct ggml_backend_graph_copy ggml_backend_graph_copy(ggml_backend_t backend, struct ggml_cgraph * graph) {
    struct ggml_hash_set hash_set = ggml_hash_set_new(graph->visited_hash_set.size);
    struct ggml_tensor ** node_copies = (ggml_tensor **) calloc(hash_set.size, sizeof(node_copies[0])); // NOLINT
    bool * node_init = (bool *) calloc(hash_set.size, sizeof(node_init[0]));

    struct ggml_init_params params = {
        /* .mem_size   = */ ggml_tensor_overhead()*hash_set.size + ggml_graph_overhead_custom(graph->size, false),
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true
    };

    struct ggml_context * ctx_allocated = ggml_init(params);
    struct ggml_context * ctx_unallocated = ggml_init(params);

    if (ctx_allocated == NULL || ctx_unallocated == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate context for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    // dup nodes
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, node);
    }

    // allocate nodes
    ggml_backend_buffer_t buffer = ggml_backend_alloc_ctx_tensors(ctx_allocated, backend);
    if (buffer == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate buffer for graph copy\n", __func__);
        ggml_hash_set_free(&hash_set);
        free(node_copies);
        free(node_init);
        ggml_free(ctx_allocated);
        ggml_free(ctx_unallocated);
        return {
            /* .buffer           = */ NULL,
            /* .ctx_allocated    = */ NULL,
            /* .ctx_unallocated  = */ NULL,
            /* .graph            = */ NULL,
        };
    }

    //printf("copy buffer size: %zu MB\n", ggml_backend_buffer_get_size(buffer) / 1024 / 1024);

    // copy data and init views
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        graph_copy_init_tensor(&hash_set, node_copies, node_init, node);
    }

    // build graph copy
    struct ggml_cgraph * graph_copy = ggml_new_graph_custom(ctx_allocated, graph->size, false);
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct ggml_tensor * node_copy = node_copies[ggml_hash_find(&hash_set, node)];
        graph_copy->nodes[i] = node_copy;
    }
    graph_copy->n_nodes = graph->n_nodes;

    ggml_hash_set_free(&hash_set);
    free(node_copies);
    free(node_init);

    return {
        /* .buffer           = */ buffer,
        /* .ctx_allocated    = */ ctx_allocated,
        /* .ctx_unallocated  = */ ctx_unallocated,
        /* .graph            = */ graph_copy,
    };
}